

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O2

void __thiscall DSDcc::DSDDstar::processVoice(DSDDstar *this)

{
  uchar *puVar1;
  char (*pacVar2) [24];
  uint uVar3;
  int *piVar4;
  int *piVar5;
  DSDDecoder *pDVar6;
  
  uVar3 = DSDSymbol::getDibit(&this->m_dsdDecoder->m_dsdSymbol);
  if (this->m_symbolIndex == 0) {
    pDVar6 = this->m_dsdDecoder;
    pacVar2 = pDVar6->ambe_fr;
    *(char *)((long)(pacVar2 + 3) + 8) = '\0';
    *(char *)((long)(pacVar2 + 3) + 9) = '\0';
    *(char *)((long)(pacVar2 + 3) + 10) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0xb) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0xc) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0xd) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0xe) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0xf) = '\0';
    pacVar2 = pDVar6->ambe_fr;
    *(char *)((long)(pacVar2 + 3) + 0x10) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0x11) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0x12) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0x13) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0x14) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0x15) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0x16) = '\0';
    *(char *)((long)(pacVar2 + 3) + 0x17) = '\0';
    pacVar2 = pDVar6->ambe_fr;
    *(char *)((long)(pacVar2 + 2) + 0x10) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0x11) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0x12) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0x13) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0x14) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0x15) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0x16) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0x17) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 0) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 1) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 2) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 3) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 4) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 5) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 6) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 3) + 7) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 0) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 1) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 2) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 3) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 4) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 5) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 6) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 2) + 7) = '\0';
    pacVar2 = pDVar6->ambe_fr;
    *(char *)((long)(pacVar2 + 2) + 8) = '\0';
    *(char *)((long)(pacVar2 + 2) + 9) = '\0';
    *(char *)((long)(pacVar2 + 2) + 10) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0xb) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0xc) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0xd) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0xe) = '\0';
    *(char *)((long)(pacVar2 + 2) + 0xf) = '\0';
    pacVar2 = pDVar6->ambe_fr;
    *(char *)((long)(pacVar2 + 1) + 8) = '\0';
    *(char *)((long)(pacVar2 + 1) + 9) = '\0';
    *(char *)((long)(pacVar2 + 1) + 10) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0xb) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0xc) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0xd) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0xe) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0xf) = '\0';
    pacVar2 = pDVar6->ambe_fr;
    *(char *)((long)(pacVar2 + 1) + 0x10) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0x11) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0x12) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0x13) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0x14) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0x15) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0x16) = '\0';
    *(char *)((long)(pacVar2 + 1) + 0x17) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x10) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x11) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x12) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x13) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x14) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x15) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x16) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0x17) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 0) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 1) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 2) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 3) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 4) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 5) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 6) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 1) + 7) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 1) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 2) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 3) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 4) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 5) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 6) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 7) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 8) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 9) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 10) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0xb) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0xc) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0xd) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0xe) = '\0';
    *(char *)((long)(pDVar6->ambe_fr + 0) + 0xf) = '\0';
    pDVar6 = this->m_dsdDecoder;
    pDVar6->m_mbeDVFrame1[8] = '\0';
    pDVar6->m_mbeDVFrame1[0] = '\0';
    pDVar6->m_mbeDVFrame1[1] = '\0';
    pDVar6->m_mbeDVFrame1[2] = '\0';
    pDVar6->m_mbeDVFrame1[3] = '\0';
    pDVar6->m_mbeDVFrame1[4] = '\0';
    pDVar6->m_mbeDVFrame1[5] = '\0';
    pDVar6->m_mbeDVFrame1[6] = '\0';
    pDVar6->m_mbeDVFrame1[7] = '\0';
    piVar5 = &dW;
    this->w = &dW;
    piVar4 = &dX;
    this->x = &dX;
  }
  else {
    piVar5 = this->w;
    piVar4 = this->x;
  }
  this->m_dsdDecoder->ambe_fr[*piVar5][*piVar4] = (byte)uVar3 & 1;
  piVar5 = this->w;
  this->w = piVar5 + 1;
  this->x = this->x + 1;
  puVar1 = this->m_dsdDecoder->m_mbeDVFrame1 + this->m_symbolIndex / 8;
  *puVar1 = *puVar1 | (byte)((uVar3 & 1) << ((byte)this->m_symbolIndex & 7));
  if (this->m_symbolIndex == 0x47) {
    pDVar6 = this->m_dsdDecoder;
    if ((pDVar6->m_opts).errorbars == 1) {
      DSDLogger::log(&pDVar6->m_dsdLogger,(double)(piVar5 + 1));
      pDVar6 = this->m_dsdDecoder;
    }
    DSDMBEDecoder::processFrame
              (&pDVar6->m_mbeDecoder1,(char (*) [23])0x0,pDVar6->ambe_fr,(char (*) [24])0x0);
    this->m_dsdDecoder->m_mbeDVReady1 = true;
    this->m_symbolIndex = 0;
    if (this->m_voiceFrameCount < 0x14) {
      this->m_frameType = DStarDataFrame;
      this->m_voiceFrameCount = this->m_voiceFrameCount + 1;
    }
    else {
      this->m_frameType = DStarSyncFrame;
    }
  }
  else {
    this->m_symbolIndex = this->m_symbolIndex + 1;
  }
  return;
}

Assistant:

void DSDDstar::processVoice()
{
    unsigned char bit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get bit from symbol and store it in cache

    if (m_symbolIndex == 0) {
        initVoiceFrame();
    }

    m_dsdDecoder->ambe_fr[*w][*x] = (1 & bit);
    w++;
    x++;

    storeSymbolDV(m_symbolIndex, (1 & bit)); // store bits in order in DVSI frame

    if (m_symbolIndex == 72-1)
    {
//        std::cerr << "DSDDstar::processVoice: " << m_voiceFrameCount << std::endl;

        if (m_dsdDecoder->m_opts.errorbars == 1) {
            m_dsdDecoder->getLogger().log("\nMBE: ");
        }

        m_dsdDecoder->m_mbeDecoder1.processFrame(0, m_dsdDecoder->ambe_fr, 0);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        m_symbolIndex = 0;

        if (m_voiceFrameCount < 20)
        {
            m_frameType = DStarDataFrame;
            m_voiceFrameCount++;
        }
        else
        {
            m_frameType = DStarSyncFrame;
        }
    }
    else
    {
        m_symbolIndex++;
    }
}